

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateOrthogonal::Initialize
          (ChLinkMateOrthogonal *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> mpt1,
          ChVector<double> mpt2,ChVector<double> mnorm1,ChVector<double> mnorm2)

{
  undefined7 in_register_00000009;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> _Stack_178;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_168;
  ChVector<double> local_158;
  ChFrame<double> local_138;
  ChFrame<double> local_b0;
  
  if ((int)CONCAT71(in_register_00000009,pos_are_relative) == 0) {
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_158,
               (ChFrame<double> *)
               (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (ChVector<double> *)mpt1.m_data[0]);
    if (&local_158 != &this->reldir1) {
      (this->reldir1).m_data[0] = local_158.m_data[0];
      (this->reldir1).m_data[1] = local_158.m_data[1];
      (this->reldir1).m_data[2] = local_158.m_data[2];
    }
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_158,
               (ChFrame<double> *)
               (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (ChVector<double> *)mpt1.m_data[1]);
    if (&local_158 == &this->reldir2) goto LAB_00ae711d;
    (this->reldir2).m_data[0] = local_158.m_data[0];
    (this->reldir2).m_data[1] = local_158.m_data[1];
  }
  else {
    if (&this->reldir1 != (ChVector<double> *)mpt1.m_data[0]) {
      (this->reldir1).m_data[0] = *(double *)mpt1.m_data[0];
      (this->reldir1).m_data[1] = *(double *)((long)mpt1.m_data[0] + 8);
      (this->reldir1).m_data[2] = *(double *)((long)mpt1.m_data[0] + 0x10);
    }
    if (&this->reldir2 == (ChVector<double> *)mpt1.m_data[1]) goto LAB_00ae711d;
    (this->reldir2).m_data[0] = *(double *)mpt1.m_data[1];
    (this->reldir2).m_data[1] = *(double *)((long)mpt1.m_data[1] + 8);
    local_158.m_data[2] = *(double *)((long)mpt1.m_data[1] + 0x10);
  }
  (this->reldir2).m_data[2] = local_158.m_data[2];
LAB_00ae711d:
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1 =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2 =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (**(code **)((long)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.
                     super_ChPhysicsItem.super_ChObj._vptr_ChObj + 0x98))
            ((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.
             super_ChPhysicsItem.super_ChObj.ChTime,this,1);
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_168,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_178,
             &mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>);
  ChFrame<double>::ChFrame(&local_b0,&(this->super_ChLinkMateGeneric).frame1);
  ChFrame<double>::ChFrame(&local_138,&(this->super_ChLinkMateGeneric).frame2);
  ChLinkMateGeneric::Initialize
            (&this->super_ChLinkMateGeneric,(shared_ptr<chrono::ChBodyFrame> *)&local_168,
             (shared_ptr<chrono::ChBodyFrame> *)&_Stack_178,true,&local_b0,&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_178._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
  return;
}

Assistant:

void ChLinkMateOrthogonal::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                      std::shared_ptr<ChBodyFrame> mbody2,
                                      bool pos_are_relative,
                                      ChVector<> mpt1,
                                      ChVector<> mpt2,
                                      ChVector<> mnorm1,
                                      ChVector<> mnorm2) {
    // set the two frames so that they have the X axis aligned
    ChVector<> mabsnorm1, mabsnorm2;
    if (pos_are_relative) {
        reldir1 = mnorm1;
        reldir2 = mnorm2;
    } else {
        reldir1 = mbody1->TransformDirectionParentToLocal(mnorm1);
        reldir2 = mbody2->TransformDirectionParentToLocal(mnorm2);
    }

    // do this asap otherwise the following Update() won't work..
    this->Body1 = mbody1.get();
    this->Body2 = mbody2.get();

    // Force the alignment of frames so that the X axis is cross product of two dirs, etc.
    // by calling the custom update function of ChLinkMateOrthogonal.
    this->Update(this->ChTime);

    // Perform initialization (set pointers to variables, etc.)
    ChLinkMateGeneric::Initialize(mbody1, mbody2,
                                  true,  // recycle already-updated frames
                                  this->frame1, this->frame2);
}